

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O1

void secp256k1_dleq_challenge_hash
               (secp256k1_scalar *e,uchar *algo16,secp256k1_ge *gen2,secp256k1_ge *r1,
               secp256k1_ge *r2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  uchar buf32 [32];
  secp256k1_sha256 sha;
  uchar local_c8 [48];
  secp256k1_sha256 local_98;
  
  secp256k1_sha256_initialize_tagged(&local_98,(uchar *)"ECDSAAdaptorSig",0xf);
  secp256k1_dleq_serialize_point(local_c8,(secp256k1_ge *)algo16);
  secp256k1_sha256_write(&local_98,local_c8,0x21);
  secp256k1_dleq_serialize_point(local_c8,gen2);
  secp256k1_sha256_write(&local_98,local_c8,0x21);
  secp256k1_dleq_serialize_point(local_c8,r1);
  secp256k1_sha256_write(&local_98,local_c8,0x21);
  secp256k1_dleq_serialize_point(local_c8,r2);
  secp256k1_sha256_write(&local_98,local_c8,0x21);
  secp256k1_dleq_serialize_point(local_c8,p1);
  secp256k1_sha256_write(&local_98,local_c8,0x21);
  secp256k1_sha256_finalize(&local_98,local_c8);
  secp256k1_scalar_set_b32(e,local_c8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_dleq_challenge_hash(secp256k1_scalar *e, const unsigned char *algo16, const secp256k1_ge *gen2, const secp256k1_ge *r1, const secp256k1_ge *r2, const secp256k1_ge *p1, const secp256k1_ge *p2) {
    secp256k1_sha256 sha;
    unsigned char buf32[32];

    secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len(algo16));
    secp256k1_dleq_hash_point(&sha, gen2);
    secp256k1_dleq_hash_point(&sha, r1);
    secp256k1_dleq_hash_point(&sha, r2);
    secp256k1_dleq_hash_point(&sha, p1);
    secp256k1_dleq_hash_point(&sha, p2);
    secp256k1_sha256_finalize(&sha, buf32);

    secp256k1_scalar_set_b32(e, buf32, NULL);
}